

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall V2Transport::ProcessReceivedKeyBytes(V2Transport *this)

{
  long lVar1;
  Span<const_std::byte> ellswift_00;
  Span<const_unsigned_char> s;
  string_view source_file;
  string_view logging_function;
  Span<const_std::byte> aad;
  Span<const_std::byte> contents;
  Span<std::byte> output;
  bool bVar2;
  ConstevalFormatString<1U> fmt;
  size_type sVar3;
  size_type sVar4;
  const_iterator pvVar5;
  const_iterator pvVar6;
  size_t sVar7;
  size_t in_RDI;
  long in_FS_OFFSET;
  Span<std::byte> SVar8;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock47;
  EllSwiftPubKey ellswift;
  Span<std::byte> *in_stack_fffffffffffffdb8;
  undefined4 uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  array<std::byte,_0UL> *in_stack_fffffffffffffdc0;
  BIP324Cipher *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffdd8;
  byte *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffdf0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_fffffffffffffdf8;
  LogFlags in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  int source_line;
  undefined1 in_stack_fffffffffffffe37;
  array<unsigned_char,_12UL> *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  byte *in_stack_fffffffffffffe98;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffea0;
  size_t sVar10;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_138;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  EllSwiftPubKey *in_stack_fffffffffffffee0;
  BIP324Cipher *in_stack_fffffffffffffee8;
  Level in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  
  source_line = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar10 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,
             (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),(AnnotatedMixin<std::mutex> *)0x209de3)
  ;
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,
             (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),(Mutex *)0x209e0c);
  inline_assertion_check<false,bool>
            ((bool *)in_stack_fffffffffffffdd8._M_current,
             (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),(char *)in_stack_fffffffffffffdc0,
             (char *)in_stack_fffffffffffffdb8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdb8);
  fmt.fmt = (char *)EllSwiftPubKey::size();
  inline_assertion_check<false,bool>
            ((bool *)in_stack_fffffffffffffdd8._M_current,
             (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),(char *)in_stack_fffffffffffffdc0,
             (char *)in_stack_fffffffffffffdb8);
  if ((*(byte *)(in_RDI + 0x2d8) & 1) == 0) {
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffdb8);
    sVar4 = std::array<unsigned_char,_12UL>::size
                      ((array<unsigned_char,_12UL> *)in_stack_fffffffffffffdb8);
    if (sVar4 + 4 <= sVar3) {
      in_stack_fffffffffffffe38 = &ProcessReceivedKeyBytes::MATCH;
      pvVar5 = std::array<unsigned_char,_12UL>::begin
                         ((array<unsigned_char,_12UL> *)in_stack_fffffffffffffdb8);
      pvVar6 = std::array<unsigned_char,_12UL>::end
                         ((array<unsigned_char,_12UL> *)in_stack_fffffffffffffdb8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdc0)
      ;
      in_stack_fffffffffffffea0 =
           __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_fffffffffffffdc8,(difference_type)in_stack_fffffffffffffdc0);
      bVar2 = std::
              equal<unsigned_char_const*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((uchar *)in_stack_fffffffffffffdc8,(uchar *)in_stack_fffffffffffffdc0,
                         in_stack_fffffffffffffdd8);
      if (bVar2) {
        bVar2 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffffdb8,Trace);
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     in_stack_fffffffffffffdd8._M_current,
                     (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     in_stack_fffffffffffffdd8._M_current,
                     (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
          Span<unsigned_char>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<unsigned_char> *)in_stack_fffffffffffffdc8,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
          Span<unsigned_char>::first
                    ((Span<unsigned_char> *)in_stack_fffffffffffffdc8,
                     (size_t)in_stack_fffffffffffffdc0);
          Span<const_unsigned_char>::Span<unsigned_char,_0>
                    ((Span<const_unsigned_char> *)in_stack_fffffffffffffdb8,
                     (Span<unsigned_char> *)0x20a064);
          uVar9 = (undefined4)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
          s.m_size = (size_t)pvVar6;
          s.m_data = pvVar5;
          HexStr_abi_cxx11_(s);
          this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(uVar9,1);
          logging_function._M_str = in_stack_fffffffffffffe88;
          logging_function._M_len = in_stack_fffffffffffffe80;
          source_file._M_str = in_stack_fffffffffffffe78;
          source_file._M_len = in_RDI;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function,source_file,source_line,in_stack_fffffffffffffe20,
                     in_stack_ffffffffffffff60,fmt,in_stack_ffffffffffffff70);
          std::__cxx11::string::~string(this_00);
        }
        bVar2 = false;
        goto LAB_0020a468;
      }
    }
  }
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffdb8);
  sVar7 = EllSwiftPubKey::size();
  if (sVar3 == sVar7) {
    MakeByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdc8);
    ellswift_00.m_size = (size_t)in_stack_fffffffffffffde8;
    ellswift_00.m_data = in_stack_fffffffffffffde0;
    EllSwiftPubKey::EllSwiftPubKey
              ((EllSwiftPubKey *)in_stack_fffffffffffffdd8._M_current,ellswift_00);
    MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffdb8);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (char *)in_stack_fffffffffffffde0,
               (int)((ulong)in_stack_fffffffffffffdd8._M_current >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffdd8._M_current >> 0x18,0));
    BIP324Cipher::Initialize
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf,
               (bool)in_stack_fffffffffffffede);
    SetReceiveState((V2Transport *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                    (RecvState)((ulong)in_stack_fffffffffffffdc8 >> 0x38));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdb8);
    SetSendState((V2Transport *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 (SendState)((ulong)in_stack_fffffffffffffdc8 >> 0x38));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdb8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffdd8._M_current,
               CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
    BIP324Cipher::GetSendGarbageTerminator(in_stack_fffffffffffffdc8);
    Span<const_std::byte>::begin((Span<const_std::byte> *)in_stack_fffffffffffffdb8);
    BIP324Cipher::GetSendGarbageTerminator(in_stack_fffffffffffffdc8);
    Span<const_std::byte>::end((Span<const_std::byte> *)in_stack_fffffffffffffdb8);
    MakeWritableByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdc8);
    Span<std::byte>::last
              ((Span<std::byte> *)in_stack_fffffffffffffdc8,(size_t)in_stack_fffffffffffffdc0);
    Span<std::byte>::begin(in_stack_fffffffffffffdb8);
    std::copy<std::byte_const*,std::byte*>
              (in_stack_fffffffffffffdd8._M_current,
               (byte *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
               (byte *)in_stack_fffffffffffffdc8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdb8);
    std::array<std::byte,_0UL>::size((array<std::byte,_0UL> *)in_stack_fffffffffffffdb8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffdd8._M_current,
               CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
    Span<std::byte_const>::Span<std::array<std::byte,0ul>>
              ((Span<const_std::byte> *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
    MakeByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdc8);
    MakeWritableByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdc8);
    std::array<std::byte,_0UL>::size((array<std::byte,_0UL> *)in_stack_fffffffffffffdb8);
    SVar8 = Span<std::byte>::last
                      ((Span<std::byte> *)in_stack_fffffffffffffdc8,
                       (size_t)in_stack_fffffffffffffdc0);
    local_138 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)SVar8.m_data;
    contents.m_size._0_7_ = in_stack_fffffffffffffeb0;
    contents.m_data = (byte *)sVar10;
    contents.m_size._7_1_ = in_stack_fffffffffffffeb7;
    aad.m_size = (size_t)in_stack_fffffffffffffea0._M_current;
    aad.m_data = in_stack_fffffffffffffe98;
    output.m_size._0_6_ = in_stack_fffffffffffffed8;
    output.m_data = (byte *)SVar8.m_size;
    output.m_size._6_1_ = in_stack_fffffffffffffede;
    output.m_size._7_1_ = in_stack_fffffffffffffedf;
    BIP324Cipher::Encrypt
              ((BIP324Cipher *)in_stack_fffffffffffffe38,contents,aad,
               (bool)in_stack_fffffffffffffe37,output);
    ClearShrink<std::vector<unsigned_char,std::allocator<unsigned_char>>>(local_138);
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)local_138);
  }
  bVar2 = true;
LAB_0020a468:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool V2Transport::ProcessReceivedKeyBytes() noexcept
{
    AssertLockHeld(m_recv_mutex);
    AssertLockNotHeld(m_send_mutex);
    Assume(m_recv_state == RecvState::KEY);
    Assume(m_recv_buffer.size() <= EllSwiftPubKey::size());

    // As a special exception, if bytes 4-16 of the key on a responder connection match the
    // corresponding bytes of a V1 version message, but bytes 0-4 don't match the network magic
    // (if they did, we'd have switched to V1 state already), assume this is a peer from
    // another network, and disconnect them. They will almost certainly disconnect us too when
    // they receive our uniformly random key and garbage, but detecting this case specially
    // means we can log it.
    static constexpr std::array<uint8_t, 12> MATCH = {'v', 'e', 'r', 's', 'i', 'o', 'n', 0, 0, 0, 0, 0};
    static constexpr size_t OFFSET = std::tuple_size_v<MessageStartChars>;
    if (!m_initiating && m_recv_buffer.size() >= OFFSET + MATCH.size()) {
        if (std::equal(MATCH.begin(), MATCH.end(), m_recv_buffer.begin() + OFFSET)) {
            LogDebug(BCLog::NET, "V2 transport error: V1 peer with wrong MessageStart %s\n",
                     HexStr(Span(m_recv_buffer).first(OFFSET)));
            return false;
        }
    }

    if (m_recv_buffer.size() == EllSwiftPubKey::size()) {
        // Other side's key has been fully received, and can now be Diffie-Hellman combined with
        // our key to initialize the encryption ciphers.

        // Initialize the ciphers.
        EllSwiftPubKey ellswift(MakeByteSpan(m_recv_buffer));
        LOCK(m_send_mutex);
        m_cipher.Initialize(ellswift, m_initiating);

        // Switch receiver state to GARB_GARBTERM.
        SetReceiveState(RecvState::GARB_GARBTERM);
        m_recv_buffer.clear();

        // Switch sender state to READY.
        SetSendState(SendState::READY);

        // Append the garbage terminator to the send buffer.
        m_send_buffer.resize(m_send_buffer.size() + BIP324Cipher::GARBAGE_TERMINATOR_LEN);
        std::copy(m_cipher.GetSendGarbageTerminator().begin(),
                  m_cipher.GetSendGarbageTerminator().end(),
                  MakeWritableByteSpan(m_send_buffer).last(BIP324Cipher::GARBAGE_TERMINATOR_LEN).begin());

        // Construct version packet in the send buffer, with the sent garbage data as AAD.
        m_send_buffer.resize(m_send_buffer.size() + BIP324Cipher::EXPANSION + VERSION_CONTENTS.size());
        m_cipher.Encrypt(
            /*contents=*/VERSION_CONTENTS,
            /*aad=*/MakeByteSpan(m_send_garbage),
            /*ignore=*/false,
            /*output=*/MakeWritableByteSpan(m_send_buffer).last(BIP324Cipher::EXPANSION + VERSION_CONTENTS.size()));
        // We no longer need the garbage.
        ClearShrink(m_send_garbage);
    } else {
        // We still have to receive more key bytes.
    }
    return true;
}